

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O3

const_buffer * __thiscall
cppcms::impl::cgi::scgi::format_output
          (const_buffer *__return_storage_ptr__,scgi *this,const_buffer *in,bool param_2,
          error_code *param_3)

{
  char *pcVar1;
  undefined4 uVar2;
  const_buffer tmp;
  buffer_impl<const_char_*> local_48;
  
  if (this->headers_written_ == true) {
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.size =
         (in->super_buffer_impl<const_char_*>).entry_.size;
    uVar2 = *(undefined4 *)&(in->super_buffer_impl<const_char_*>).field_0x4;
    pcVar1 = (in->super_buffer_impl<const_char_*>).entry_.ptr;
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ =
         (in->super_buffer_impl<const_char_*>).size_;
    *(undefined4 *)&(__return_storage_ptr__->super_buffer_impl<const_char_*>).field_0x4 = uVar2;
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.ptr = pcVar1;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector(&(__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_,
             &(in->super_buffer_impl<const_char_*>).vec_);
  }
  else {
    this->headers_written_ = true;
    local_48.size_ = 0;
    local_48.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add
              (&local_48,(this->headers_)._M_dataplus._M_p,(this->headers_)._M_string_length);
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.size = local_48.entry_.size;
    *(ulong *)&__return_storage_ptr__->super_buffer_impl<const_char_*> =
         CONCAT44(local_48._4_4_,local_48.size_);
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.ptr = local_48.entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector(&(__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_,&local_48.vec_);
    booster::aio::details::add<booster::aio::const_buffer>(__return_storage_ptr__,in);
    if (local_48.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &in,bool /*comleted*/,booster::system::error_code &/*e*/) 
		{
			if(headers_written_)
				return in;
			headers_written_=true;
			return booster::aio::buffer(headers_) + in;
		}